

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

QRect __thiscall QColumnView::visualRect(QColumnView *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  QColumnViewPrivate *pQVar3;
  qsizetype qVar4;
  const_reference ppQVar5;
  undefined8 in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QRect QVar6;
  int i;
  QColumnViewPrivate *d;
  QRect rect;
  QRect *in_stack_ffffffffffffff88;
  QModelIndex *in_stack_ffffffffffffff90;
  int local_4c;
  undefined8 local_18;
  undefined8 local_10;
  
  QVar6._8_8_ = local_10;
  QVar6._0_8_ = local_18;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QModelIndex::isValid(in_stack_ffffffffffffff90);
  if (bVar2) {
    pQVar3 = d_func((QColumnView *)0x863631);
    local_4c = 0;
    while( true ) {
      qVar4 = QList<QAbstractItemView_*>::size(&pQVar3->columns);
      if (qVar4 <= local_4c) break;
      ppQVar5 = QList<QAbstractItemView_*>::at
                          ((QList<QAbstractItemView_*> *)in_stack_ffffffffffffff90,
                           (qsizetype)in_stack_ffffffffffffff88);
      QVar6 = (QRect)(**(code **)(*(long *)&((*ppQVar5)->super_QAbstractScrollArea).super_QFrame.
                                            super_QWidget + 0x1e0))(*ppQVar5,in_RSI);
      bVar2 = QRect::isNull((QRect *)in_stack_ffffffffffffff90);
      if (!bVar2) {
        QList<QAbstractItemView_*>::at
                  ((QList<QAbstractItemView_*> *)in_stack_ffffffffffffff90,
                   (qsizetype)in_stack_ffffffffffffff88);
        QWidget::frameGeometry(in_RDI);
        QRect::topLeft(in_stack_ffffffffffffff88);
        QRect::translate((QRect *)in_stack_ffffffffffffff90,(QPoint *)in_stack_ffffffffffffff88);
        goto LAB_00863725;
      }
      local_4c = local_4c + 1;
    }
    QRect::QRect((QRect *)in_stack_ffffffffffffff90);
  }
  else {
    QRect::QRect((QRect *)in_stack_ffffffffffffff90);
  }
LAB_00863725:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QRect QColumnView::visualRect(const QModelIndex &index) const
{
    if (!index.isValid())
        return QRect();

    Q_D(const QColumnView);
    for (int i = 0; i < d->columns.size(); ++i) {
        QRect rect = d->columns.at(i)->visualRect(index);
        if (!rect.isNull()) {
            rect.translate(d->columns.at(i)->frameGeometry().topLeft());
            return rect;
        }
    }
    return QRect();
}